

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a4ad3::KeywordsSink::put
          (KeywordsSink *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *errorCode)

{
  UList *pUVar1;
  bool bVar2;
  ResourceValue *data;
  UBool UVar3;
  int iVar4;
  char *pcVar5;
  char *data_00;
  size_t sVar6;
  char *ownedDefault;
  UnicodeString local_e0;
  undefined1 local_a0 [8];
  CharString defcoll;
  UResType type;
  int32_t i;
  ResourceTable collations;
  UErrorCode *errorCode_local;
  UBool param_3_local;
  ResourceValue *value_local;
  char *key_local;
  KeywordsSink *this_local;
  
  collations._32_8_ = errorCode;
  value_local = (ResourceValue *)key;
  key_local = (char *)this;
  UVar3 = ::U_FAILURE(*errorCode);
  if (UVar3 == '\0') {
    (*(value->super_UObject)._vptr_UObject[0xb])(&type,value,collations._32_8_);
    defcoll._60_4_ = 0;
    while (UVar3 = icu_63::ResourceTable::getKeyAndValue
                             ((ResourceTable *)&type,defcoll._60_4_,(char **)&value_local,value),
          UVar3 != '\0') {
      defcoll.len = (*(value->super_UObject)._vptr_UObject[3])();
      if (defcoll.len == 0) {
        if ((this->hasDefault == '\0') &&
           (iVar4 = strcmp((char *)value_local,"default"), iVar4 == 0)) {
          icu_63::CharString::CharString((CharString *)local_a0);
          icu_63::ResourceValue::getUnicodeString(&local_e0,value,(UErrorCode *)collations._32_8_);
          icu_63::CharString::appendInvariantChars
                    ((CharString *)local_a0,&local_e0,(UErrorCode *)collations._32_8_);
          icu_63::UnicodeString::~UnicodeString(&local_e0);
          UVar3 = ::U_SUCCESS(*(UErrorCode *)collations._32_8_);
          if ((UVar3 == '\0') ||
             (UVar3 = icu_63::CharString::isEmpty((CharString *)local_a0), UVar3 != '\0')) {
LAB_00273b6f:
            bVar2 = false;
          }
          else {
            pcVar5 = icu_63::CharString::data((CharString *)local_a0);
            pcVar5 = uprv_strdup_63(pcVar5);
            if (pcVar5 != (char *)0x0) {
              pUVar1 = this->values;
              data_00 = icu_63::CharString::data((CharString *)local_a0);
              ulist_removeString_63(pUVar1,data_00);
              ulist_addItemBeginList_63(this->values,pcVar5,'\x01',(UErrorCode *)collations._32_8_);
              this->hasDefault = '\x01';
              goto LAB_00273b6f;
            }
            *(undefined4 *)collations._32_8_ = 7;
            bVar2 = true;
          }
          icu_63::CharString::~CharString((CharString *)local_a0);
          if (bVar2) {
            return;
          }
        }
      }
      else if ((defcoll.len == 2) &&
              (iVar4 = strncmp((char *)value_local,"private-",8), data = value_local, iVar4 != 0)) {
        pUVar1 = this->values;
        sVar6 = strlen((char *)value_local);
        UVar3 = ulist_containsString_63(pUVar1,(char *)data,(int32_t)sVar6);
        if (UVar3 == '\0') {
          ulist_addItemEndList_63(this->values,value_local,'\0',(UErrorCode *)collations._32_8_);
        }
      }
      UVar3 = ::U_FAILURE(*(UErrorCode *)collations._32_8_);
      if (UVar3 != '\0') {
        return;
      }
      defcoll._60_4_ = defcoll._60_4_ + 1;
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool /*noFallback*/,
                     UErrorCode &errorCode) {
        if (U_FAILURE(errorCode)) { return; }
        ResourceTable collations = value.getTable(errorCode);
        for (int32_t i = 0; collations.getKeyAndValue(i, key, value); ++i) {
            UResType type = value.getType();
            if (type == URES_STRING) {
                if (!hasDefault && uprv_strcmp(key, "default") == 0) {
                    CharString defcoll;
                    defcoll.appendInvariantChars(value.getUnicodeString(errorCode), errorCode);
                    if (U_SUCCESS(errorCode) && !defcoll.isEmpty()) {
                        char *ownedDefault = uprv_strdup(defcoll.data());
                        if (ownedDefault == NULL) {
                            errorCode = U_MEMORY_ALLOCATION_ERROR;
                            return;
                        }
                        ulist_removeString(values, defcoll.data());
                        ulist_addItemBeginList(values, ownedDefault, TRUE, &errorCode);
                        hasDefault = TRUE;
                    }
                }
            } else if (type == URES_TABLE && uprv_strncmp(key, "private-", 8) != 0) {
                if (!ulist_containsString(values, key, (int32_t)uprv_strlen(key))) {
                    ulist_addItemEndList(values, key, FALSE, &errorCode);
                }
            }
            if (U_FAILURE(errorCode)) { return; }
        }
    }